

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

long __thiscall CTcPrsOpMod::calc_result(CTcPrsOpMod *this,long a,long b,int *ov)

{
  *ov = 0;
  if (b != 0) {
    return a % b;
  }
  CTcTokenizer::log_error(0x2af9);
  return 1;
}

Assistant:

long CTcPrsOpMod::calc_result(long a, long b, int &ov) const
{
    /* there's no way for integer modulo to overflow */
    ov = FALSE;
    
    /* check for divide-by-zero */
    if (b == 0)
    {
        /* log a divide-by-zero error */
        G_tok->log_error(TCERR_CONST_DIV_ZERO);

        /* the result isn't really meaningful, but return something anyway */
        return 1;
    }
    else
    {
        /* return the result */
        return a % b;
    }
}